

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupOutputVec(Gia_Man_t *p,Vec_Int_t *vOutPres)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vOutPres_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x10c,"Gia_Man_t *Gia_ManDupOutputVec(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManPoNum(p);
  iVar2 = Vec_IntSize(vOutPres);
  if (iVar1 == iVar2) {
    Gia_ManFillValue(p);
    iVar1 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(iVar1);
    pcVar4 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar4;
    pcVar4 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar4;
    pGVar5 = Gia_ManConst0(p);
    pGVar5->Value = 0;
    local_2c = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar6 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCi(p,local_2c);
        bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      uVar3 = Gia_ManAppendCi(p_00);
      pGStack_28->Value = uVar3;
      local_2c = local_2c + 1;
    }
    local_2c = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar6 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCo(p,local_2c);
        bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Vec_IntEntry(vOutPres,local_2c);
      if (iVar1 != 0) {
        pGVar5 = Gia_ObjFanin0(pGStack_28);
        Gia_ManDupOrderDfs_rec(p_00,p,pGVar5);
      }
      local_2c = local_2c + 1;
    }
    local_2c = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar6 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCo(p,local_2c);
        bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Vec_IntEntry(vOutPres,local_2c);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(pGStack_28);
        uVar3 = Gia_ManAppendCo(p_00,iVar1);
        pGStack_28->Value = uVar3;
      }
      local_2c = local_2c + 1;
    }
    return p_00;
  }
  __assert_fail("Gia_ManPoNum(p) == Vec_IntSize(vOutPres)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                ,0x10d,"Gia_Man_t *Gia_ManDupOutputVec(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupOutputVec( Gia_Man_t * p, Vec_Int_t * vOutPres )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManPoNum(p) == Vec_IntSize(vOutPres) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vOutPres, i) )
            Gia_ManDupOrderDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vOutPres, i) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    return pNew;
}